

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database.h
# Opt level: O2

void __thiscall DatabaseException::DatabaseException(DatabaseException *this,string *reason)

{
  *(undefined ***)this = &PTR__DatabaseException_001c5d68;
  std::__cxx11::string::string((string *)&this->reason,(string *)reason);
  return;
}

Assistant:

explicit DatabaseException(std::string reason): reason(reason) {}